

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts3UpdateMethod(sqlite3_vtab *pVtab,int nArg,sqlite3_value **apVal,sqlite_int64 *pRowid)

{
  sqlite3_stmt *psVar1;
  u8 *puVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  Mem *pMem;
  sqlite3_tokenizer_module *psVar7;
  Fts3Table *pFVar8;
  sqlite3_tokenizer_cursor *psVar9;
  Fts3SegReader **pStmt;
  uint uVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  uchar *puVar14;
  i64 iVar15;
  u64 uVar16;
  sqlite3_stmt *psVar17;
  sqlite3_int64 iDocid_00;
  byte bVar18;
  char cVar19;
  long lVar20;
  u32 *puVar21;
  sqlite3_uint64 n;
  sqlite3_stmt *psVar22;
  int iCol_1;
  ulong uVar23;
  sqlite3_value *psVar24;
  u32 *pnWord;
  char *pcVar25;
  u32 *puVar26;
  char *pcVar27;
  ulong uVar28;
  ulong uVar29;
  long lVar30;
  bool bVar31;
  bool bVar32;
  int local_134;
  Fts3Table *local_130;
  sqlite3_stmt *local_128;
  long local_120;
  int nChng;
  i64 iDocid;
  sqlite3_tokenizer_cursor *pT;
  undefined8 uStack_100;
  undefined8 local_f8;
  u32 *local_e8;
  i64 iCol;
  int iDum1;
  int local_cc;
  u32 *local_c8;
  ulong local_c0;
  ulong local_b8;
  int local_ac;
  int local_a8;
  int iDum2;
  sqlite3_stmt *pAllLangid;
  Fts3MultiSegReader csr;
  
  local_134 = 0;
  nChng = 0;
  local_130 = (Fts3Table *)pVtab;
  if (nArg < 2) {
LAB_001a2b17:
    puVar21 = (u32 *)sqlite3_malloc64((long)*(int *)&pVtab[2].pModule * 8 + 8);
    if (puVar21 != (u32 *)0x0) {
      lVar20 = (long)(*(int *)&pVtab[2].pModule + 1);
      memset(puVar21,0,lVar20 * 8);
      if (*(int *)((long)&pVtab[0x14].zErrMsg + 4) == 0) {
        iVar12 = fts3SqlStmt((Fts3Table *)pVtab,0x10,(sqlite3_stmt **)&csr,(sqlite3_value **)0x0);
        pStmt = csr.apSegment;
        pVtab = &local_130->base;
        if (iVar12 != 0) goto LAB_001a3575;
        sqlite3_bind_null((sqlite3_stmt *)csr.apSegment,1);
        sqlite3_step((sqlite3_stmt *)pStmt);
        local_134 = sqlite3_reset((sqlite3_stmt *)pStmt);
        pVtab = &local_130->base;
        iVar12 = local_134;
        if (local_134 != 0) goto LAB_001a3575;
      }
      else {
        local_134 = 0;
      }
      bVar31 = true;
      local_128 = (sqlite3_stmt *)pRowid;
      if ((1 < nArg) && (local_130->zContentTbl == (char *)0x0)) {
        psVar24 = apVal[(long)local_130->nColumn + 3];
        uVar4._0_2_ = psVar24->flags;
        uVar4._2_1_ = psVar24->enc;
        uVar4._3_1_ = psVar24->eSubtype;
        bVar18 = (byte)(undefined2)uVar4;
        if ((0xaaaaaaaaU >> (uVar4 & 0x1f) & 1) != 0) {
          psVar24 = apVal[1];
          bVar18 = (byte)psVar24->flags;
        }
        if ((0xaaaaaaaaUL >> (bVar18 & 0x1f) & 1) == 0) {
          pMem = *apVal;
          uVar5._0_2_ = pMem->flags;
          uVar5._2_1_ = pMem->enc;
          uVar5._3_1_ = pMem->eSubtype;
          if ((0xaaaaaaaaU >> (uVar5 & 0x1f) & 1) == 0) {
            local_120 = sqlite3VdbeIntValue(pMem);
            iVar15 = sqlite3VdbeIntValue(psVar24);
            bVar31 = true;
            if (local_120 == iVar15) goto LAB_001a318b;
          }
          bVar31 = local_130->db->vtabOnConflict == '\x05';
          if (bVar31) {
            local_134 = fts3DeleteByRowid(local_130,psVar24,&nChng,puVar21);
          }
          else {
            local_134 = fts3InsertData(local_130,apVal,(sqlite3_int64 *)local_128);
          }
          pVtab = &local_130->base;
          iVar12 = local_134;
          if (local_134 != 0) goto LAB_001a3575;
        }
      }
LAB_001a318b:
      bVar32 = true;
      psVar24 = *apVal;
      uVar6._0_2_ = psVar24->flags;
      uVar6._2_1_ = psVar24->enc;
      uVar6._3_1_ = psVar24->eSubtype;
      if ((0xaaaaaaaaU >> (uVar6 & 0x1f) & 1) == 0) {
        local_134 = fts3DeleteByRowid(local_130,psVar24,&nChng,puVar21);
        bVar32 = local_134 == 0;
      }
      pVtab = &local_130->base;
      puVar26 = puVar21 + lVar20;
      if ((1 < nArg) && (bVar32)) {
        psVar17 = (sqlite3_stmt *)sqlite3VdbeIntValue(apVal[(long)local_130->nColumn + 4]);
        psVar22 = local_128;
        if ((bVar31) &&
           (local_134 = fts3InsertData((Fts3Table *)pVtab,apVal,(sqlite3_int64 *)local_128),
           local_134 != 0)) {
          iVar12 = local_134;
          if ((local_134 == 0x13) && (((Fts3Table *)pVtab)->zContentTbl == (char *)0x0)) {
            local_134 = 0x10b;
            iVar12 = local_134;
          }
        }
        else {
          iVar12 = fts3PendingTermsDocid((Fts3Table *)pVtab,0,(int)psVar17,*(sqlite_int64 *)psVar22)
          ;
          pFVar8 = local_130;
          if (iVar12 == 0) {
            local_134 = 0;
            pnWord = puVar26;
            local_128 = psVar17;
            for (lVar20 = 0; lVar20 + 2 < (long)local_130->nColumn + 2; lVar20 = lVar20 + 1) {
              if (local_130->abNotindexed[lVar20] == '\0') {
                puVar14 = sqlite3_value_text(apVal[lVar20 + 2]);
                iVar12 = fts3PendingTermsAdd(pFVar8,(int)local_128,(char *)puVar14,(int)lVar20,
                                             pnWord);
                pVtab = &local_130->base;
                if (iVar12 != 0) goto LAB_001a32ba;
                iVar12 = sqlite3_value_bytes(apVal[lVar20 + 2]);
                puVar26[pFVar8->nColumn] = puVar26[pFVar8->nColumn] + iVar12;
              }
              pnWord = pnWord + 1;
            }
            pVtab = &local_130->base;
            iVar12 = 0;
          }
        }
LAB_001a32ba:
        local_134 = iVar12;
        if (((Fts3Table *)pVtab)->bHasDocsize != '\0') {
          fts3InsertDocsize(&local_134,(Fts3Table *)pVtab,puVar26);
        }
        nChng = nChng + 1;
      }
      iVar12 = local_134;
      if (((Fts3Table *)pVtab)->bFts4 != '\0') {
        fts3UpdateDocTotals(&local_134,(Fts3Table *)pVtab,puVar26,puVar21,nChng);
        iVar12 = local_134;
      }
      goto LAB_001a3575;
    }
    local_134 = 7;
    iVar12 = local_134;
  }
  else {
    psVar24 = *apVal;
    uVar10._0_2_ = psVar24->flags;
    uVar10._2_1_ = psVar24->enc;
    uVar10._3_1_ = psVar24->eSubtype;
    if (((0xaaaaaaaaU >> (uVar10 & 0x1f) & 1) == 0) ||
       (psVar24 = apVal[(long)*(int *)&pVtab[2].pModule + 2], uVar3._0_2_ = psVar24->flags,
       uVar3._2_1_ = psVar24->enc, uVar3._3_1_ = psVar24->eSubtype,
       (0xaaaaaaaaU >> (uVar3 & 0x1f) & 1) != 0)) {
      iVar15 = sqlite3VdbeIntValue(apVal[(long)*(int *)&pVtab[2].pModule + 4]);
      if (-1 < (int)iVar15) goto LAB_001a2b17;
      local_134 = 0x13;
      iVar12 = local_134;
    }
    else {
      puVar14 = sqlite3_value_text(psVar24);
      uVar10 = sqlite3_value_bytes(psVar24);
      if (puVar14 == (uchar *)0x0) {
        iVar12 = 7;
      }
      else {
        iVar12 = 1;
        if (uVar10 == 7) {
          iVar11 = sqlite3_strnicmp((char *)puVar14,"rebuild",7);
          if (iVar11 != 0) goto LAB_001a3035;
          iVar12 = fts3DeleteAll((Fts3Table *)pVtab,0);
          if (iVar12 != 0) goto LAB_001a3572;
          csr.apSegment = (Fts3SegReader **)0x0;
          pcVar27 = sqlite3_mprintf("SELECT %s",pVtab[0x12].pModule);
          if (pcVar27 == (char *)0x0) {
LAB_001a3380:
            pT = (sqlite3_tokenizer_cursor *)CONCAT44(pT._4_4_,7);
            local_e8 = (u32 *)0x0;
            puVar21 = (u32 *)0x0;
            puVar26 = (u32 *)0x0;
            iVar12 = 7;
          }
          else {
            local_e8 = (u32 *)0x0;
            iVar12 = sqlite3_prepare_v2((sqlite3 *)pVtab[1].pModule,pcVar27,-1,(sqlite3_stmt **)&csr
                                        ,(char **)0x0);
            pT = (sqlite3_tokenizer_cursor *)CONCAT44(pT._4_4_,iVar12);
            sqlite3_free(pcVar27);
            pFVar8 = local_130;
            puVar21 = (u32 *)0x0;
            puVar26 = (u32 *)0x0;
            if (iVar12 == 0) {
              n = (long)local_130->nColumn * 0xc + 0xc;
              puVar26 = (u32 *)sqlite3_malloc64(n);
              if (puVar26 == (u32 *)0x0) goto LAB_001a3380;
              memset(puVar26,0,n);
              puVar21 = puVar26 + (long)pFVar8->nColumn + 1;
              local_e8 = puVar21 + (long)pFVar8->nColumn + 1;
              iVar12 = 0;
            }
          }
          uVar29 = 0;
          local_128 = (sqlite3_stmt *)csr.apSegment;
          local_c8 = puVar21;
          while ((psVar22 = local_128, iVar12 == 0 &&
                 (iVar12 = sqlite3_step(local_128), pFVar8 = local_130, iVar12 == 100))) {
            local_c0 = uVar29;
            iVar12 = langidFromSelect(local_130,psVar22);
            iDocid_00 = sqlite3_column_int64(psVar22,0);
            local_120 = CONCAT44(local_120._4_4_,iVar12);
            iVar12 = fts3PendingTermsDocid(pFVar8,0,iVar12,iDocid_00);
            memset(puVar26,0,(long)pFVar8->nColumn * 4 + 4);
            puVar21 = puVar26;
            for (lVar20 = 0; (psVar22 = local_128, iVar12 == 0 && (lVar20 < local_130->nColumn));
                lVar20 = lVar20 + 1) {
              iVar12 = 0;
              if (local_130->abNotindexed[lVar20] == '\0') {
                iVar11 = (int)lVar20 + 1;
                puVar14 = sqlite3_column_text(local_128,iVar11);
                pFVar8 = local_130;
                iVar12 = fts3PendingTermsAdd(local_130,(int)local_120,(char *)puVar14,(int)lVar20,
                                             puVar21);
                iVar11 = sqlite3_column_bytes(psVar22,iVar11);
                puVar26[pFVar8->nColumn] = puVar26[pFVar8->nColumn] + iVar11;
              }
              puVar21 = puVar21 + 1;
            }
            pT = (sqlite3_tokenizer_cursor *)CONCAT44(pT._4_4_,iVar12);
            if (local_130->bHasDocsize != '\0') {
              fts3InsertDocsize((int *)&pT,local_130,puVar26);
              iVar12 = (int)pT;
            }
            uVar29 = local_c0;
            puVar21 = local_c8;
            if (iVar12 == 0) {
              for (lVar20 = 0; lVar20 <= local_130->nColumn; lVar20 = lVar20 + 1) {
                local_c8[lVar20] = local_c8[lVar20] + puVar26[lVar20];
              }
              uVar29 = (ulong)((int)local_c0 + 1);
              iVar12 = 0;
            }
            else {
              sqlite3_finalize(local_128);
              iVar12 = 1;
              local_128 = (sqlite3_stmt *)0x0;
            }
          }
          if (local_130->bFts4 != '\0') {
            fts3UpdateDocTotals((int *)&pT,local_130,puVar21,local_e8,(int)uVar29);
          }
          sqlite3_free(puVar26);
          if (psVar22 == (sqlite3_stmt *)0x0) {
            pVtab = &local_130->base;
            iVar12 = (int)pT;
          }
          else {
            iVar12 = sqlite3_finalize(psVar22);
            pVtab = &local_130->base;
            if ((int)pT != 0) {
              iVar12 = (int)pT;
            }
          }
        }
        else if (uVar10 == 0xf) {
          iVar11 = sqlite3_strnicmp((char *)puVar14,"integrity-check",0xf);
          if (iVar11 != 0) goto LAB_001a3035;
          pAllLangid = (sqlite3_stmt *)0x0;
          uVar28 = 0;
          iVar11 = fts3SqlStmt((Fts3Table *)pVtab,0x1b,&pAllLangid,(sqlite3_value **)0x0);
          psVar22 = pAllLangid;
          uVar29 = 0;
          if (iVar11 == 0) {
            sqlite3_bind_int(pAllLangid,1,pVtab[0x15].nRef);
            sqlite3_bind_int(psVar22,2,*(int *)&pVtab[0x14].pModule);
            uVar29 = 0;
            while ((iVar11 = (int)uVar28, iVar11 == 0 &&
                   (iVar12 = sqlite3_step(psVar22), iVar12 == 100))) {
              uVar28 = 0;
              iVar12 = sqlite3_column_int(psVar22,0);
              local_120 = CONCAT44(local_120._4_4_,iVar12);
              iVar12 = 0;
              while (psVar22 = pAllLangid, iVar12 < ((Fts3Table *)pVtab)->nIndex) {
                pT = (sqlite3_tokenizer_cursor *)0x0;
                uStack_100._0_4_ = 0;
                uStack_100._4_4_ = 0;
                csr.apSegment = (Fts3SegReader **)0x0;
                csr.nSegment = 0;
                csr.nAdvance = 0;
                csr.pFilter = (Fts3SegFilter *)0x0;
                csr.aBuffer = (char *)0x0;
                csr.nBuffer = 0;
                csr.iColFilter = 0;
                csr.bRestart = 0;
                csr.nCost = 0;
                csr.bLookup = 0;
                csr._52_4_ = 0;
                csr.zTerm = (char *)0x0;
                csr.nTerm = 0;
                csr._68_4_ = 0;
                csr.aDoclist = (char *)0x0;
                csr.nDoclist = 0;
                csr._84_4_ = 0;
                local_f8._0_4_ = 0x13;
                local_f8._4_4_ = 0;
                local_128 = (sqlite3_stmt *)CONCAT44(local_128._4_4_,iVar12);
                uVar10 = sqlite3Fts3SegReaderCursor
                                   ((Fts3Table *)pVtab,(int)local_120,iVar12,-2,(char *)0x0,0,0,1,
                                    &csr);
                if ((uVar10 == 0) &&
                   (uVar10 = sqlite3Fts3SegReaderStart((Fts3Table *)pVtab,&csr,(Fts3SegFilter *)&pT)
                   , uVar10 == 0)) {
                  uVar23 = 0;
                  local_b8 = uVar29;
                  while (uVar10 = sqlite3Fts3SegReaderStep((Fts3Table *)pVtab,&csr),
                        pcVar27 = csr.aDoclist, uVar29 = local_b8, uVar10 == 100) {
                    iDocid = 0;
                    pcVar25 = csr.aDoclist + csr.nDoclist;
                    iCol = 0;
                    iVar12 = sqlite3Fts3GetVarint(csr.aDoclist,&iDocid);
                    pcVar27 = pcVar27 + iVar12;
                    lVar20 = 0;
                    while (pVtab = &local_130->base, pcVar27 < pcVar25) {
                      _iDum1 = 0;
                      iVar12 = sqlite3Fts3GetVarint(pcVar27,(sqlite_int64 *)&iDum1);
                      pcVar27 = pcVar27 + iVar12;
                      if (pcVar27 < pcVar25) {
                        if (_iDum1 < 2) {
                          iCol = 0;
                          if (_iDum1 == 0) {
                            iVar12 = sqlite3Fts3GetVarint(pcVar27,(sqlite_int64 *)&iDum1);
                            iDocid = iDocid + _iDum1;
                          }
                          else {
                            iVar12 = sqlite3Fts3GetVarint(pcVar27,&iCol);
                          }
                          pcVar27 = pcVar27 + iVar12;
                          lVar20 = 0;
                        }
                        else {
                          lVar20 = lVar20 + _iDum1 + -2;
                          uVar16 = fts3ChecksumEntry(csr.zTerm,csr.nTerm,(int)local_120,
                                                     (int)local_128,iDocid,(int)iCol,(int)lVar20);
                          uVar23 = uVar23 ^ uVar16;
                        }
                      }
                    }
                  }
                }
                else {
                  uVar23 = 0;
                }
                uVar28 = (ulong)uVar10;
                sqlite3Fts3SegReaderFinish(&csr);
                uVar29 = uVar29 ^ uVar23;
                iVar12 = (int)local_128 + 1;
              }
            }
            iVar12 = sqlite3_reset(psVar22);
            if ((iVar11 == 0) && (iVar11 = iVar12, iVar12 == 0)) {
              psVar7 = ((Fts3Table *)pVtab)->pTokenizer->pModule;
              csr.apSegment = (Fts3SegReader **)0x0;
              pcVar27 = sqlite3_mprintf("SELECT %s");
              if (pcVar27 == (char *)0x0) {
                iVar11 = 7;
                psVar22 = (sqlite3_stmt *)0x0;
              }
              else {
                iVar11 = sqlite3_prepare_v2(((Fts3Table *)pVtab)->db,pcVar27,-1,
                                            (sqlite3_stmt **)&csr,(char **)0x0);
                sqlite3_free(pcVar27);
                psVar22 = (sqlite3_stmt *)csr.apSegment;
              }
              uVar28 = 0;
              local_b8 = uVar29;
              while ((iVar11 == 0 && (iVar12 = sqlite3_step(psVar22), iVar12 == 100))) {
                local_c0 = sqlite3_column_int64(psVar22,0);
                iVar12 = langidFromSelect((Fts3Table *)pVtab,psVar22);
                psVar17 = (sqlite3_stmt *)0x0;
                local_120 = CONCAT44(local_120._4_4_,iVar12);
                iVar11 = 0;
                while ((iVar11 == 0 && ((long)psVar17 < (long)((Fts3Table *)pVtab)->nColumn))) {
                  psVar1 = psVar17 + 1;
                  puVar2 = ((Fts3Table *)pVtab)->abNotindexed + (long)psVar17;
                  psVar17 = psVar1;
                  iVar11 = 0;
                  if (*puVar2 == '\0') {
                    local_128 = psVar1;
                    puVar14 = sqlite3_column_text(psVar22,(int)psVar1);
                    iVar12 = sqlite3_column_bytes(psVar22,(int)local_128);
                    pT = (sqlite3_tokenizer_cursor *)0x0;
                    iVar11 = sqlite3Fts3OpenTokenizer
                                       (((Fts3Table *)pVtab)->pTokenizer,(int)local_120,
                                        (char *)puVar14,iVar12,&pT);
                    psVar9 = pT;
                    local_c8 = (u32 *)CONCAT44(local_c8._4_4_,(int)local_128 + -1);
                    psVar17 = local_128;
                    while (iVar11 == 0) {
                      iCol = iCol & 0xffffffff00000000;
                      _iDum1 = _iDum1 & 0xffffffff00000000;
                      iDum2 = 0;
                      local_cc = 0;
                      iVar11 = (*psVar7->xNext)(psVar9,(char **)&iDocid,(int *)&iCol,&iDum1,&iDum2,
                                                &local_cc);
                      psVar17 = local_128;
                      if (iVar11 == 0) {
                        iVar13 = (int)iCol;
                        local_a8 = local_cc;
                        local_e8 = (u32 *)iDocid;
                        local_ac = iVar11;
                        uVar16 = fts3ChecksumEntry((char *)iDocid,(int)iCol,(int)local_120,0,
                                                   local_c0,(int)local_c8,local_cc);
                        uVar28 = uVar28 ^ uVar16;
                        iVar12 = ((Fts3Table *)pVtab)->nIndex;
                        lVar20 = 0x28;
                        psVar17 = local_128;
                        for (lVar30 = 1; pVtab = &local_130->base, uVar29 = local_b8,
                            iVar11 = local_ac, lVar30 < iVar12; lVar30 = lVar30 + 1) {
                          iVar11 = *(int *)((long)&local_130->aIndex->nPrefix + lVar20);
                          if (iVar11 <= iVar13) {
                            uVar16 = fts3ChecksumEntry((char *)local_e8,iVar11,(int)local_120,
                                                       (int)lVar30,local_c0,(int)local_c8,local_a8);
                            uVar28 = uVar28 ^ uVar16;
                            psVar17 = local_128;
                          }
                          lVar20 = lVar20 + 0x28;
                        }
                      }
                    }
                    if (psVar9 != (sqlite3_tokenizer_cursor *)0x0) {
                      (*psVar7->xClose)(psVar9);
                      psVar17 = local_128;
                    }
                    if (iVar11 == 0x65) {
                      iVar11 = 0;
                    }
                  }
                }
              }
              sqlite3_finalize(psVar22);
            }
            else {
              uVar28 = 0;
            }
          }
          iVar12 = 0x10b;
          if (uVar29 == uVar28) {
            iVar12 = iVar11;
          }
          if (iVar11 != 0) {
            iVar12 = iVar11;
          }
        }
        else if (uVar10 == 8) {
          iVar11 = sqlite3_strnicmp((char *)puVar14,"optimize",8);
          if (iVar11 == 0) {
            iVar12 = fts3DoOptimize((Fts3Table *)pVtab,0);
          }
          else {
LAB_001a3035:
            iVar11 = 8;
            iVar13 = sqlite3_strnicmp((char *)puVar14,"merge=",6);
            if (iVar13 == 0) {
              csr.apSegment = (Fts3SegReader **)(puVar14 + 6);
              iVar13 = fts3Getint((char **)&csr);
              cVar19 = *(char *)csr.apSegment;
              if (cVar19 == ',') {
                if (*(char *)((long)csr.apSegment + 1) != '\0') {
                  csr.apSegment = (Fts3SegReader **)((long)csr.apSegment + 1);
                  iVar11 = fts3Getint((char **)&csr);
                  cVar19 = *(char *)csr.apSegment;
                  goto LAB_001a314f;
                }
              }
              else {
LAB_001a314f:
                if (1 < iVar11 && cVar19 == '\0') {
                  pT = (sqlite3_tokenizer_cursor *)((ulong)pT & 0xffffffff00000000);
                  if (*(char *)((long)&pVtab[0x12].zErrMsg + 5) == '\0') {
                    sqlite3Fts3CreateStatTable((int *)&pT,(Fts3Table *)pVtab);
                    iVar12 = (int)pT;
                    if ((int)pT == 0) goto LAB_001a3314;
                  }
                  else {
LAB_001a3314:
                    iVar12 = sqlite3Fts3Incrmerge((Fts3Table *)pVtab,iVar13,iVar11);
                  }
                  sqlite3Fts3SegmentsClose((Fts3Table *)pVtab);
                  goto LAB_001a3572;
                }
              }
              iVar12 = 1;
            }
            else if ((10 < uVar10) &&
                    (iVar13 = sqlite3_strnicmp((char *)puVar14,"automerge=",10), iVar13 == 0)) {
              csr.apSegment = (Fts3SegReader **)(puVar14 + 10);
              iDocid = iDocid & 0xffffffff00000000;
              pT = (sqlite3_tokenizer_cursor *)0x0;
              iVar13 = fts3Getint((char **)&csr);
              iVar12 = iVar13;
              if (0x10 < iVar13) {
                iVar12 = 8;
              }
              if (iVar13 == 1) {
                iVar12 = iVar11;
              }
              *(int *)&pVtab[4].pModule = iVar12;
              if (*(char *)((long)&pVtab[0x12].zErrMsg + 5) == '\0') {
                sqlite3Fts3CreateStatTable((int *)&iDocid,(Fts3Table *)pVtab);
                iVar12 = (int)iDocid;
                if ((int)iDocid != 0) goto LAB_001a3572;
              }
              iVar12 = fts3SqlStmt((Fts3Table *)pVtab,0x17,(sqlite3_stmt **)&pT,
                                   (sqlite3_value **)0x0);
              psVar9 = pT;
              if (iVar12 == 0) {
                sqlite3_bind_int64((sqlite3_stmt *)pT,1,2);
                sqlite3_bind_int((sqlite3_stmt *)psVar9,2,*(int *)&pVtab[4].pModule);
                sqlite3_step((sqlite3_stmt *)psVar9);
                iVar12 = sqlite3_reset((sqlite3_stmt *)psVar9);
              }
            }
          }
        }
        else if (6 < (int)uVar10) goto LAB_001a3035;
      }
    }
  }
LAB_001a3572:
  local_134 = iVar12;
  puVar21 = (u32 *)0x0;
  iVar12 = local_134;
LAB_001a3575:
  local_134 = iVar12;
  sqlite3_free(puVar21);
  sqlite3Fts3SegmentsClose((Fts3Table *)pVtab);
  return local_134;
}

Assistant:

static int fts3UpdateMethod(
  sqlite3_vtab *pVtab,            /* Virtual table handle */
  int nArg,                       /* Size of argument array */
  sqlite3_value **apVal,          /* Array of arguments */
  sqlite_int64 *pRowid            /* OUT: The affected (or effected) rowid */
){
  return sqlite3Fts3UpdateMethod(pVtab, nArg, apVal, pRowid);
}